

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O0

int diff(int argc,char **argv)

{
  Point2i p;
  Point2i p_00;
  Allocator alloc;
  WrapMode2D wrapMode;
  WrapMode2D wrapMode_00;
  Point2i p_01;
  Point2i p_02;
  Allocator alloc_00;
  Allocator alloc_01;
  span<int> out;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  reference pvVar7;
  Tuple2<pbrt::Point2,_int> TVar8;
  Tuple2<pbrt::Point2,_int> TVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long *in_RSI;
  Float FVar13;
  float fVar14;
  undefined1 auVar15 [64];
  string deltaString;
  float delta;
  Float imageAverage;
  Float refAverage;
  ImageChannelValues error;
  Image diffImage;
  int c;
  int x;
  int y;
  int nRefClamped;
  int nClamped;
  anon_class_1_0_00000001 print;
  Image *image;
  ImageAndMetadata im;
  ImageMetadata *refMetadata;
  Image *refImage;
  ImageAndMetadata refRead;
  anon_class_1_0_00000001 onError;
  array<int,_4UL> cropWindow;
  string metric;
  string referenceFile;
  string imageFile;
  string outFile;
  Image *in_stack_ffffffffffffee08;
  undefined4 uVar16;
  ImageAndMetadata *in_stack_ffffffffffffee10;
  undefined4 in_stack_ffffffffffffee18;
  WrapMode in_stack_ffffffffffffee1c;
  undefined4 in_stack_ffffffffffffee20;
  Float in_stack_ffffffffffffee24;
  size_t in_stack_ffffffffffffee28;
  ImageChannelValues *in_stack_ffffffffffffee30;
  char *in_stack_ffffffffffffee38;
  undefined7 in_stack_ffffffffffffee40;
  undefined1 in_stack_ffffffffffffee47;
  undefined1 in_stack_ffffffffffffee48 [64];
  undefined1 auVar17 [48];
  Image *in_stack_ffffffffffffee88;
  int in_stack_ffffffffffffee90;
  WrapMode in_stack_ffffffffffffee94;
  WrapMode in_stack_ffffffffffffee98;
  int in_stack_ffffffffffffee9c;
  int in_stack_ffffffffffffeea0;
  string *in_stack_ffffffffffffeec8;
  Bounds2i *in_stack_ffffffffffffef60;
  Image *in_stack_ffffffffffffef68;
  undefined7 in_stack_ffffffffffffef70;
  undefined1 in_stack_ffffffffffffef77;
  Float in_stack_ffffffffffffef78;
  int in_stack_ffffffffffffef7c;
  undefined4 in_stack_ffffffffffffefe0;
  undefined4 in_stack_ffffffffffffefe4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffefe8;
  FILE *pFVar18;
  string *in_stack_ffffffffffffeff0;
  undefined4 in_stack_ffffffffffffeff8;
  undefined4 in_stack_ffffffffffffeffc;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *in_stack_fffffffffffff028;
  string *in_stack_fffffffffffff030;
  char ***in_stack_fffffffffffff038;
  undefined8 in_stack_fffffffffffff040;
  undefined7 in_stack_fffffffffffff048;
  undefined1 in_stack_fffffffffffff04f;
  bool local_ef1;
  optional<float> local_ed0;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_ec8;
  undefined4 local_e88;
  aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)> local_e84;
  undefined4 local_e44;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> local_e40;
  undefined4 local_e30;
  aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)> local_e2c;
  undefined4 local_e24;
  optional<int> in_stack_fffffffffffff1e0;
  optional<float> in_stack_fffffffffffff1e8;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  in_stack_fffffffffffff1f0;
  Image *in_stack_fffffffffffff1f8;
  Image *in_stack_fffffffffffff200;
  Image *in_stack_fffffffffffff208;
  ImageChannelDesc *in_stack_fffffffffffff210;
  Image *in_stack_fffffffffffff218;
  undefined1 local_dcc [36];
  string local_da8 [32];
  string local_d88 [140];
  Float local_cfc;
  undefined4 local_c94;
  int local_9ec;
  Tuple2<pbrt::Point2,_int> local_9e8;
  int local_9e0;
  Tuple2<pbrt::Point2,_int> local_9dc;
  int local_9d4;
  uint local_9d0;
  uint local_9cc;
  string local_9b0 [32];
  ImageMetadata *in_stack_fffffffffffff670;
  string *in_stack_fffffffffffff678;
  Image *in_stack_fffffffffffff680;
  string local_978 [92];
  undefined4 local_91c;
  Tuple2<pbrt::Point2,_int> local_918;
  Tuple2<pbrt::Point2,_int> local_910;
  Tuple2<pbrt::Point2,_int> local_908;
  Tuple2<pbrt::Point2,_int> local_900;
  Tuple2<pbrt::Point2,_int> local_8f8;
  Tuple2<pbrt::Point2,_int> local_8f0 [41];
  Image *local_7a8;
  undefined8 in_stack_fffffffffffff8a8;
  undefined8 in_stack_fffffffffffff8b0;
  undefined8 in_stack_fffffffffffff8b8;
  Image local_418;
  byte local_1f9;
  span<int> local_1d8;
  byte local_1c3;
  byte local_1c2;
  allocator<char> local_1c1;
  string local_1c0 [39];
  byte local_199;
  byte local_173;
  byte local_172;
  allocator<char> local_171;
  string local_170 [39];
  byte local_149;
  byte local_123;
  byte local_122;
  allocator<char> local_121;
  string local_120 [71];
  allocator<char> local_d9;
  string local_d8 [36];
  undefined8 local_b4;
  undefined8 local_ac;
  allocator<char> local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [32];
  long *local_10;
  int local_4;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffee48._8_8_,in_stack_ffffffffffffee48._0_8_,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
  std::allocator<char>::~allocator(&local_91);
  local_b4 = 0xffffffff;
  local_ac = 0xffffffff;
  while (*local_10 != 0) {
    std::allocator<char>::allocator();
    local_122 = 0;
    local_123 = 0;
    local_149 = 0;
    local_172 = 0;
    local_173 = 0;
    local_199 = 0;
    local_1c2 = 0;
    local_1c3 = 0;
    local_1f9 = 0;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffee48._8_8_,in_stack_ffffffffffffee48._0_8_,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
    std::function<void(std::__cxx11::string)>::function<diff(int,char**)::__0&,void>
              ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
    bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                      ((char ***)CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                       in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                        *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
    local_ef1 = true;
    if (!bVar1) {
      std::allocator<char>::allocator();
      local_122 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffee48._8_8_,in_stack_ffffffffffffee48._0_8_,
                 (allocator<char> *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
      local_123 = 1;
      std::function<void(std::__cxx11::string)>::function<diff(int,char**)::__0&,void>
                ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                 (anon_class_1_0_00000001 *)
                 CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
      local_149 = 1;
      bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                        ((char ***)CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                         in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
      local_ef1 = true;
      if (!bVar1) {
        std::allocator<char>::allocator();
        local_172 = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffee48._8_8_,in_stack_ffffffffffffee48._0_8_,
                   (allocator<char> *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40))
        ;
        local_173 = 1;
        std::function<void(std::__cxx11::string)>::function<diff(int,char**)::__0&,void>
                  ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                    *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                   (anon_class_1_0_00000001 *)
                   CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
        local_199 = 1;
        bVar1 = pbrt::ParseArg<std::__cxx11::string*>
                          ((char ***)CONCAT44(in_stack_ffffffffffffeffc,in_stack_ffffffffffffeff8),
                           in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
        local_ef1 = true;
        if (!bVar1) {
          std::allocator<char>::allocator();
          local_1c2 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffee48._8_8_,in_stack_ffffffffffffee48._0_8_,
                     (allocator<char> *)
                     CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
          local_1c3 = 1;
          local_1d8 = pstd::MakeSpan<std::array<int,_4UL>_>
                                ((array<int,_4UL> *)in_stack_ffffffffffffee10);
          std::function<void(std::__cxx11::string)>::function<diff(int,char**)::__0&,void>
                    ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                      *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                     (anon_class_1_0_00000001 *)
                     CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
          local_1f9 = 1;
          out.n._0_7_ = in_stack_fffffffffffff048;
          out.ptr = (int *)in_stack_fffffffffffff040;
          out.n._7_1_ = in_stack_fffffffffffff04f;
          local_ef1 = pbrt::ParseArg<pstd::span<int>>
                                (in_stack_fffffffffffff038,in_stack_fffffffffffff030,out,
                                 in_stack_fffffffffffff028);
        }
      }
    }
    if ((local_1f9 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d7f72);
    }
    if ((local_1c3 & 1) != 0) {
      std::__cxx11::string::~string(local_1c0);
    }
    if ((local_1c2 & 1) != 0) {
      std::allocator<char>::~allocator(&local_1c1);
    }
    if ((local_199 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d7fbd);
    }
    if ((local_173 & 1) != 0) {
      std::__cxx11::string::~string(local_170);
    }
    if ((local_172 & 1) != 0) {
      std::allocator<char>::~allocator(&local_171);
    }
    if ((local_149 & 1) != 0) {
      std::
      function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
      ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                   *)0x3d8008);
    }
    if ((local_123 & 1) != 0) {
      std::__cxx11::string::~string(local_120);
    }
    if ((local_122 & 1) != 0) {
      std::allocator<char>::~allocator(&local_121);
    }
    std::
    function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::~function((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                 *)0x3d8047);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator(&local_d9);
    if (local_ef1 == false) {
      if (*(char *)*local_10 == '-') {
        usage("diff","%s: unknown command flag",*local_10);
      }
      else {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          usage("diff","%s: excess argument",*local_10);
        }
        else {
          std::__cxx11::string::operator=(local_50,(char *)*local_10);
          local_10 = local_10 + 1;
        }
      }
    }
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    usage("diff","must specify image to compute difference with.");
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) != 0) {
    usage("diff","must specify --reference image");
  }
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
  if (((bVar1) &&
      (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08), bVar1))
     && (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08),
        bVar1)) {
    uVar10 = std::__cxx11::string::c_str();
    usage("diff","%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",uVar10);
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffee10);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  pbrt::Image::Read((string *)in_stack_fffffffffffff8b0,(Allocator)in_stack_fffffffffffff8b8,
                    (ColorEncodingHandle *)in_stack_fffffffffffff8a8);
  pvVar7 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                      (size_type)in_stack_ffffffffffffee08);
  if (*pvVar7 < 0) {
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    iVar2 = *pvVar7;
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    iVar3 = *pvVar7;
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    *pvVar7 = iVar2 - iVar3;
  }
  pvVar7 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                      (size_type)in_stack_ffffffffffffee08);
  if (*pvVar7 < 0) {
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    iVar2 = *pvVar7;
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    iVar3 = *pvVar7;
    pvVar7 = std::array<int,_4UL>::operator[]
                       ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                        (size_type)in_stack_ffffffffffffee08);
    *pvVar7 = iVar2 - iVar3;
  }
  pvVar7 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                      (size_type)in_stack_ffffffffffffee08);
  if ((-1 < *pvVar7) &&
     (pvVar7 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                          (size_type)in_stack_ffffffffffffee08), -1 < *pvVar7)) {
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)in_stack_ffffffffffffee10,
               (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)in_stack_ffffffffffffee10,
               (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08);
    pbrt::Bounds2<int>::Bounds2
              ((Bounds2<int> *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
               (Point2<int> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18),
               (Point2<int> *)in_stack_ffffffffffffee10);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffee10);
    alloc_00.memoryResource._7_1_ = in_stack_ffffffffffffef77;
    alloc_00.memoryResource._0_7_ = in_stack_ffffffffffffef70;
    pbrt::Image::Crop(in_stack_ffffffffffffef68,in_stack_ffffffffffffef60,alloc_00);
    pbrt::Image::operator=(&in_stack_ffffffffffffee10->image,in_stack_ffffffffffffee08);
    pbrt::Image::~Image(&in_stack_ffffffffffffee10->image);
  }
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffee10);
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
  pbrt::Image::Read((string *)in_stack_fffffffffffff8b0,(Allocator)in_stack_fffffffffffff8b8,
                    (ColorEncodingHandle *)in_stack_fffffffffffff8a8);
  local_7a8 = (Image *)&stack0xfffffffffffff870;
  pvVar7 = std::array<int,_4UL>::operator[]
                     ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                      (size_type)in_stack_ffffffffffffee08);
  if ((-1 < *pvVar7) &&
     (pvVar7 = std::array<int,_4UL>::operator[]
                         ((array<int,_4UL> *)in_stack_ffffffffffffee10,
                          (size_type)in_stack_ffffffffffffee08), -1 < *pvVar7)) {
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)in_stack_ffffffffffffee10,
               (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    std::array<int,_4UL>::operator[]
              ((array<int,_4UL> *)in_stack_ffffffffffffee10,(size_type)in_stack_ffffffffffffee08);
    pbrt::Point2<int>::Point2
              ((Point2<int> *)in_stack_ffffffffffffee10,
               (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),(int)in_stack_ffffffffffffee08);
    pbrt::Bounds2<int>::Bounds2
              ((Bounds2<int> *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
               (Point2<int> *)CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18),
               (Point2<int> *)in_stack_ffffffffffffee10);
    pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
              ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffee10);
    alloc_01.memoryResource._7_1_ = in_stack_ffffffffffffef77;
    alloc_01.memoryResource._0_7_ = in_stack_ffffffffffffef70;
    pbrt::Image::Crop(in_stack_ffffffffffffef68,in_stack_ffffffffffffef60,alloc_01);
    pbrt::Image::operator=(&in_stack_ffffffffffffee10->image,in_stack_ffffffffffffee08);
    pbrt::Image::~Image(&in_stack_ffffffffffffee10->image);
  }
  local_8f0[0] = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_7a8);
  local_8f8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_418);
  bVar1 = pbrt::Tuple2<pbrt::Point2,_int>::operator!=(local_8f0,(Point2<int> *)&local_8f8);
  if (bVar1) {
    pFVar18 = _stderr;
    uVar10 = std::__cxx11::string::c_str();
    uVar16 = (undefined4)((ulong)in_stack_ffffffffffffee08 >> 0x20);
    TVar8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_7a8);
    local_900 = TVar8;
    local_908 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_7a8);
    uVar6 = (ulong)local_908 >> 0x20;
    TVar9 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_418);
    local_910 = TVar9;
    local_918 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&local_418);
    fprintf(pFVar18,"%s: image resolution (%d, %d) doesn\'t match reference (%d, %d)\n",uVar10,
            (ulong)TVar8 & 0xffffffff,uVar6,(ulong)TVar9 & 0xffffffff,CONCAT44(uVar16,local_918.y));
    local_4 = 1;
    local_91c = 1;
  }
  else {
    iVar2 = pbrt::Image::NChannels((Image *)0x3d8ad0);
    iVar3 = pbrt::Image::NChannels((Image *)0x3d8ae6);
    if (iVar2 == iVar3) {
      pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffee48._0_8_);
      pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffee48._0_8_);
      bVar1 = std::operator!=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_ffffffffffffee10,
                              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_ffffffffffffee08);
      uVar4 = (uint)bVar1 << 0x18;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
      pFVar18 = _stderr;
      if ((uVar4 & 0x1000000) != 0) {
        uVar10 = std::__cxx11::string::c_str();
        pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffee48._0_8_);
        diff::anon_class_1_0_00000001::operator()
                  (in_stack_ffffffffffffee48._0_8_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
        uVar11 = std::__cxx11::string::c_str();
        pbrt::Image::ChannelNames_abi_cxx11_(in_stack_ffffffffffffee48._0_8_);
        diff::anon_class_1_0_00000001::operator()
                  (in_stack_ffffffffffffee48._0_8_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffee47,in_stack_ffffffffffffee40));
        uVar12 = std::__cxx11::string::c_str();
        fprintf(pFVar18,
                "Warning: image channel names don\'t match: %s has \"%s\" but reference has \"%s\".\n"
                ,uVar10,uVar11,uVar12);
        std::__cxx11::string::~string(local_9b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
        std::__cxx11::string::~string(local_978);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
      }
      pbrt::ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_ffffffffffffee08);
      pbrt::ImageMetadata::GetColorSpace((ImageMetadata *)in_stack_ffffffffffffee08);
      bVar1 = pbrt::RGBColorSpace::operator!=
                        ((RGBColorSpace *)
                         CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                         (RGBColorSpace *)
                         CONCAT44(in_stack_ffffffffffffee1c,in_stack_ffffffffffffee18));
      if (bVar1) {
        fprintf(_stderr,"Warning: computing difference of images with different color spaces!");
      }
      local_9cc = 0;
      local_9d0 = 0;
      local_9d4 = 0;
      while( true ) {
        iVar2 = local_9d4;
        local_9dc = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_7a8);
        pFVar18 = _stderr;
        if (local_9dc.y <= iVar2) break;
        local_9e0 = 0;
        while( true ) {
          iVar2 = local_9e0;
          local_9e8 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(local_7a8);
          if (local_9e8.x <= iVar2) break;
          for (local_9ec = 0; iVar2 = local_9ec, iVar3 = pbrt::Image::NChannels((Image *)0x3d8f37),
              iVar2 < iVar3; local_9ec = local_9ec + 1) {
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)in_stack_ffffffffffffee10,
                       (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                       (int)in_stack_ffffffffffffee08);
            in_stack_ffffffffffffef7c = local_9ec;
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                       in_stack_ffffffffffffee1c);
            p_01.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeea0;
            p_01.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee9c;
            wrapMode.wrap.values[1] = in_stack_ffffffffffffee98;
            wrapMode.wrap.values[0] = in_stack_ffffffffffffee94;
            in_stack_ffffffffffffef78 =
                 pbrt::Image::GetChannel
                           (in_stack_ffffffffffffee88,p_01,in_stack_ffffffffffffee48._60_4_,wrapMode
                           );
            uVar4 = std::isinf((double)(ulong)(uint)in_stack_ffffffffffffef78);
            in_stack_ffffffffffffef77 = (undefined1)uVar4;
            if ((uVar4 & 1) != 0) {
              local_9cc = local_9cc + 1;
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_ffffffffffffee10,
                         (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                         (int)in_stack_ffffffffffffee08);
              p.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee94;
              p.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee90;
              pbrt::Image::SetChannel
                        (in_stack_ffffffffffffee88,p,in_stack_ffffffffffffee48._60_4_,
                         in_stack_ffffffffffffee48._56_4_);
            }
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)in_stack_ffffffffffffee10,
                       (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                       (int)in_stack_ffffffffffffee08);
            pbrt::WrapMode2D::WrapMode2D
                      ((WrapMode2D *)CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20),
                       in_stack_ffffffffffffee1c);
            p_02.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffeea0;
            p_02.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee9c;
            wrapMode_00.wrap.values[1] = in_stack_ffffffffffffee98;
            wrapMode_00.wrap.values[0] = in_stack_ffffffffffffee94;
            FVar13 = pbrt::Image::GetChannel
                               (in_stack_ffffffffffffee88,p_02,in_stack_ffffffffffffee48._60_4_,
                                wrapMode_00);
            uVar4 = std::isinf((double)(ulong)(uint)FVar13);
            if ((uVar4 & 1) != 0) {
              local_9d0 = local_9d0 + 1;
              pbrt::Point2<int>::Point2
                        ((Point2<int> *)in_stack_ffffffffffffee10,
                         (int)((ulong)in_stack_ffffffffffffee08 >> 0x20),
                         (int)in_stack_ffffffffffffee08);
              p_00.super_Tuple2<pbrt::Point2,_int>.y = in_stack_ffffffffffffee94;
              p_00.super_Tuple2<pbrt::Point2,_int>.x = in_stack_ffffffffffffee90;
              pbrt::Image::SetChannel
                        (in_stack_ffffffffffffee88,p_00,in_stack_ffffffffffffee48._60_4_,
                         in_stack_ffffffffffffee48._56_4_);
            }
          }
          local_9e0 = local_9e0 + 1;
        }
        local_9d4 = local_9d4 + 1;
      }
      if (0 < (int)local_9cc) {
        uVar10 = std::__cxx11::string::c_str();
        fprintf(pFVar18,"%s: clamped %d infinite pixel values.\n",uVar10,(ulong)local_9cc);
      }
      pFVar18 = _stderr;
      if (0 < (int)local_9d0) {
        uVar10 = std::__cxx11::string::c_str();
        fprintf(pFVar18,"%s: clamped %d infinite pixel values.\n",uVar10,(ulong)local_9d0);
      }
      pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
                ((polymorphic_allocator<std::byte> *)in_stack_ffffffffffffee10);
      alloc.memoryResource._4_4_ = in_stack_ffffffffffffee94;
      alloc.memoryResource._0_4_ = in_stack_ffffffffffffee90;
      pbrt::Image::Image(in_stack_ffffffffffffee88,alloc);
      pbrt::Image::NChannels((Image *)0x3d9267);
      pbrt::ImageChannelValues::ImageChannelValues
                (in_stack_ffffffffffffee30,in_stack_ffffffffffffee28,in_stack_ffffffffffffee24);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
      if (bVar1) {
        pbrt::Image::AllChannelsDesc(in_stack_ffffffffffffee48._0_8_);
        pbrt::Image::L1Error
                  (in_stack_fffffffffffff1f8,(ImageChannelDesc *)in_stack_fffffffffffff1f0,
                   (Image *)in_stack_fffffffffffff1e8,(Image *)in_stack_fffffffffffff1e0);
        pbrt::ImageChannelValues::operator=
                  ((ImageChannelValues *)in_stack_ffffffffffffee10,
                   (ImageChannelValues *)in_stack_ffffffffffffee08);
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d932c);
        pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3d9339);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffee10,(char *)in_stack_ffffffffffffee08);
        if (bVar1) {
          pbrt::Image::AllChannelsDesc(in_stack_ffffffffffffee48._0_8_);
          pbrt::Image::MSE(in_stack_fffffffffffff218,in_stack_fffffffffffff210,
                           in_stack_fffffffffffff208,in_stack_fffffffffffff200);
          pbrt::ImageChannelValues::operator=
                    ((ImageChannelValues *)in_stack_ffffffffffffee10,
                     (ImageChannelValues *)in_stack_ffffffffffffee08);
          pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d9458);
          pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3d9465);
        }
        else {
          pbrt::Image::AllChannelsDesc(in_stack_ffffffffffffee48._0_8_);
          pbrt::Image::MRSE(in_stack_fffffffffffff218,in_stack_fffffffffffff210,
                            in_stack_fffffffffffff208,in_stack_fffffffffffff200);
          pbrt::ImageChannelValues::operator=
                    ((ImageChannelValues *)in_stack_ffffffffffffee10,
                     (ImageChannelValues *)in_stack_ffffffffffffee08);
          pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d9525);
          pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3d9532);
        }
      }
      FVar13 = pbrt::ImageChannelValues::MaxValue
                         ((ImageChannelValues *)
                          CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
      if ((FVar13 != 0.0) || (NAN(FVar13))) {
        pbrt::Image::AllChannelsDesc(in_stack_ffffffffffffee48._0_8_);
        pbrt::Image::Average
                  ((Image *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
                   (ImageChannelDesc *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70)
                  );
        FVar13 = pbrt::ImageChannelValues::Average
                           ((ImageChannelValues *)
                            CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d962a);
        pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3d9637);
        auVar17 = in_stack_ffffffffffffee48._16_48_;
        local_c94 = FVar13;
        pbrt::Image::AllChannelsDesc(in_stack_ffffffffffffee48._0_8_);
        pbrt::Image::Average
                  ((Image *)CONCAT44(in_stack_ffffffffffffef7c,in_stack_ffffffffffffef78),
                   (ImageChannelDesc *)CONCAT17(in_stack_ffffffffffffef77,in_stack_ffffffffffffef70)
                  );
        FVar13 = pbrt::ImageChannelValues::Average
                           ((ImageChannelValues *)
                            CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
        pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d96ac);
        pbrt::ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x3d96b9);
        local_d88._36_4_ = ((FVar13 - (float)local_c94) * 100.0) / (float)local_c94;
        iVar2 = (int)local_d88;
        local_cfc = FVar13;
        pbrt::StringPrintf<float&>(in_stack_ffffffffffffee38,(float *)in_stack_ffffffffffffee30);
        fVar14 = (float)local_d88._36_4_;
        std::abs(iVar2);
        if (fVar14 <= 0.1) {
          fVar14 = (float)local_d88._36_4_;
          std::abs(iVar2);
          if (0.001 < fVar14) {
            pbrt::Yellow(in_stack_ffffffffffffeec8);
            std::__cxx11::string::operator=(local_d88,(string *)(local_dcc + 4));
            std::__cxx11::string::~string((string *)(local_dcc + 4));
          }
        }
        else {
          pbrt::Red(in_stack_ffffffffffffeec8);
          std::__cxx11::string::operator=(local_d88,local_da8);
          std::__cxx11::string::~string(local_da8);
        }
        local_dcc._0_4_ =
             pbrt::ImageChannelValues::Average
                       ((ImageChannelValues *)
                        CONCAT44(in_stack_ffffffffffffee24,in_stack_ffffffffffffee20));
        in_stack_ffffffffffffee10 = (ImageAndMetadata *)local_dcc;
        pbrt::
        Printf<std::__cxx11::string&,std::__cxx11::string&,float&,float&,std::__cxx11::string&,std::__cxx11::string&,float>
                  (auVar17._40_8_,auVar17._32_8_,auVar17._24_8_,auVar17._16_8_,auVar17._8_8_,
                   auVar17._0_8_,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffee94,in_stack_ffffffffffffee90),
                   (float *)CONCAT44(in_stack_ffffffffffffee9c,in_stack_ffffffffffffee98));
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          local_ed0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_ed0.set = false;
          local_ed0._5_3_ = 0;
          pstd::optional<float>::optional(&local_ed0);
          auVar15 = ZEXT1664((undefined1  [16])0x0);
          local_ec8 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                       )vmovdqu64_avx512f(auVar15);
          local_e88 = 0;
          pstd::optional<pbrt::SquareMatrix<4>_>::optional
                    ((optional<pbrt::SquareMatrix<4>_> *)&local_ec8.__align);
          local_e84 = (aligned_storage_t<sizeof(pbrt::SquareMatrix<4>),_alignof(pbrt::SquareMatrix<4>)>
                       )vmovdqu64_avx512f(auVar15);
          local_e44 = 0;
          pstd::optional<pbrt::SquareMatrix<4>_>::optional
                    ((optional<pbrt::SquareMatrix<4>_> *)&local_e84.__align);
          local_e40 = (aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)>)
                      0x0;
          local_e30 = 0;
          pstd::optional<pbrt::Bounds2<int>_>::optional
                    ((optional<pbrt::Bounds2<int>_> *)&local_e40.__align);
          local_e24 = 0;
          local_e2c = (aligned_storage_t<sizeof(pbrt::Point2<int>),_alignof(pbrt::Point2<int>)>)0x0;
          pstd::optional<pbrt::Point2<int>_>::optional
                    ((optional<pbrt::Point2<int>_> *)&local_e2c.__align);
          pstd::optional<int>::optional((optional<int> *)&stack0xfffffffffffff1e0);
          pstd::optional<float>::optional((optional<float> *)&stack0xfffffffffffff1e8);
          pstd::optional<const_pbrt::RGBColorSpace_*>::optional
                    ((optional<const_pbrt::RGBColorSpace_*> *)&stack0xfffffffffffff1f0);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 *)0x3d9a81);
          pbrt::Image::Write(in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             in_stack_fffffffffffff670);
          pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)in_stack_ffffffffffffee10);
        }
        local_4 = 1;
        local_91c = 1;
        std::__cxx11::string::~string(local_d88);
      }
      else {
        local_4 = 0;
        local_91c = 1;
      }
      pbrt::ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x3d9b49);
      pbrt::Image::~Image(&in_stack_ffffffffffffee10->image);
    }
    else {
      pFVar18 = _stderr;
      uVar10 = std::__cxx11::string::c_str();
      uVar4 = pbrt::Image::NChannels((Image *)0x3d8b39);
      uVar5 = pbrt::Image::NChannels((Image *)0x3d8b4f);
      fprintf(pFVar18,"%s: image channel count %d doesn\'t match reference %d.\n",uVar10,
              (ulong)uVar4,(ulong)uVar5);
      local_4 = 1;
      local_91c = 1;
    }
  }
  pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_ffffffffffffee10);
  pbrt::ImageAndMetadata::~ImageAndMetadata(in_stack_ffffffffffffee10);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int diff(int argc, char *argv[]) {
    std::string outFile, imageFile, referenceFile, metric = "MSE";
    std::array<int, 4> cropWindow = {-1, 0, -1, 0};

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("diff", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "reference", &referenceFile, onError) ||
            ParseArg(&argv, "metric", &metric, onError) ||
            ParseArg(&argv, "crop", pstd::MakeSpan(cropWindow), onError)) {
            // success
        } else if (argv[0][0] == '-') {
            usage("diff", "%s: unknown command flag", *argv);
        } else if (!imageFile.empty()) {
            usage("diff", "%s: excess argument", *argv);
        } else {
            imageFile = *argv;
            ++argv;
        }
    }

    if (imageFile.empty())
        usage("diff", "must specify image to compute difference with.");

    if (referenceFile.empty())
        usage("diff", "must specify --reference image");

    if (metric != "L1" && metric != "MSE" && metric != "MRSE")
        usage("diff", "%s: --metric must be \"L1\", \"MSE\" or \"MRSE\".",
              metric.c_str());

    ImageAndMetadata refRead = Image::Read(referenceFile);
    Image &refImage = refRead.image;
    const ImageMetadata &refMetadata = refRead.metadata;

    // If last 2 are negative, they're taken as deltas
    if (cropWindow[1] < 0)
        cropWindow[1] = cropWindow[0] - cropWindow[1];
    if (cropWindow[3] < 0)
        cropWindow[3] = cropWindow[2] - cropWindow[3];
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        refImage = refImage.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    ImageAndMetadata im = Image::Read(imageFile);
    Image &image = im.image;

    // Crop before comparing resolutions.
    if (cropWindow[0] >= 0 && cropWindow[2] >= 0)
        image = image.Crop(
            Bounds2i({cropWindow[0], cropWindow[2]}, {cropWindow[1], cropWindow[3]}));

    if (image.Resolution() != refImage.Resolution()) {
        fprintf(stderr,
                "%s: image resolution (%d, %d) doesn't match reference (%d, %d)\n",
                imageFile.c_str(), image.Resolution().x, image.Resolution().y,
                refImage.Resolution().x, refImage.Resolution().y);
        return 1;
    }
    if (image.NChannels() != refImage.NChannels()) {
        fprintf(stderr, "%s: image channel count %d doesn't match reference %d.\n",
                imageFile.c_str(), image.NChannels(), refImage.NChannels());
        return 1;
    }

    if (image.ChannelNames() != refImage.ChannelNames()) {
        auto print = [](const std::vector<std::string> &n) {
            std::string s = n[0];
            for (size_t i = 1; i < n.size(); ++i) {
                s += ", ";
                s += n[i];
            }
            return s;
        };
        fprintf(stderr,
                "Warning: image channel names don't match: %s has \"%s\" "
                "but reference has \"%s\".\n",
                imageFile.c_str(), print(image.ChannelNames()).c_str(),
                print(refImage.ChannelNames()).c_str());
    }

    if (*im.metadata.GetColorSpace() != *refMetadata.GetColorSpace())
        fprintf(stderr, "Warning: computing difference of images with different "
                        "color spaces!");

    // Clamp Infs
    int nClamped = 0, nRefClamped = 0;
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x)
            for (int c = 0; c < image.NChannels(); ++c) {
                if (std::isinf(image.GetChannel({x, y}, c))) {
                    ++nClamped;
                    image.SetChannel({x, y}, c, 0);
                }
                if (std::isinf(refImage.GetChannel({x, y}, c))) {
                    ++nRefClamped;
                    refImage.SetChannel({x, y}, c, 0);
                }
            }
    if (nClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", imageFile.c_str(),
                nClamped);
    if (nRefClamped > 0)
        fprintf(stderr, "%s: clamped %d infinite pixel values.\n", referenceFile.c_str(),
                nRefClamped);

    Image diffImage;
    ImageChannelValues error(refImage.NChannels());
    if (metric == "L1")
        error = image.L1Error(image.AllChannelsDesc(), refImage, &diffImage);
    else if (metric == "MSE")
        error = image.MSE(image.AllChannelsDesc(), refImage, &diffImage);
    else
        error = image.MRSE(image.AllChannelsDesc(), refImage, &diffImage);

    if (error.MaxValue() == 0)
        // Same same.
        return 0;

    // Image averages
    Float refAverage = refImage.Average(refImage.AllChannelsDesc()).Average();
    Float imageAverage = image.Average(image.AllChannelsDesc()).Average();

    float delta = 100.f * (imageAverage - refAverage) / refAverage;
    std::string deltaString = StringPrintf("%f%% delta", delta);
    if (std::abs(delta) > 0.1)
        deltaString = Red(deltaString);
    else if (std::abs(delta) > 0.001)
        deltaString = Yellow(deltaString);
    Printf("Images differ:\n\t%s %s\n\tavg = %f / %f (%s), %s = %f\n", imageFile,
           referenceFile, imageAverage, refAverage, deltaString, metric, error.Average());

    if (!outFile.empty()) {
        if (!diffImage.Write(outFile))
            return 1;
    }

    return 1;
}